

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# callbacks.cpp
# Opt level: O1

IDeckLinkDeckControlStatusCallback *
cdecklink_internal_callback_create_deck_link_deck_control_status_callback
          (void *ctx,cdecklink_deck_control_status_callback_timecode_update *cb0,
          cdecklink_deck_control_status_callback_vtr_control_state_changed *cb1,
          cdecklink_deck_control_status_callback_deck_control_event_received *cb2,
          cdecklink_deck_control_status_callback_deck_control_status_changed *cb3)

{
  IDeckLinkDeckControlStatusCallback *pIVar1;
  
  if (((cb0 != (cdecklink_deck_control_status_callback_timecode_update *)0x0 ||
       cb1 != (cdecklink_deck_control_status_callback_vtr_control_state_changed *)0x0) ||
      cb2 != (cdecklink_deck_control_status_callback_deck_control_event_received *)0x0) ||
      cb3 != (cdecklink_deck_control_status_callback_deck_control_status_changed *)0x0) {
    pIVar1 = (IDeckLinkDeckControlStatusCallback *)operator_new(0x38);
    (pIVar1->super_IUnknown)._vptr_IUnknown = (_func_int **)&PTR_QueryInterface_00108a20;
    *(undefined4 *)&pIVar1[1].super_IUnknown._vptr_IUnknown = 0;
    pIVar1[2].super_IUnknown._vptr_IUnknown = (_func_int **)ctx;
    pIVar1[3].super_IUnknown._vptr_IUnknown = (_func_int **)cb0;
    pIVar1[4].super_IUnknown._vptr_IUnknown = (_func_int **)cb1;
    pIVar1[5].super_IUnknown._vptr_IUnknown = (_func_int **)cb2;
    pIVar1[6].super_IUnknown._vptr_IUnknown = (_func_int **)cb3;
    return pIVar1;
  }
  return (IDeckLinkDeckControlStatusCallback *)0x0;
}

Assistant:

IDeckLinkDeckControlStatusCallback* cdecklink_internal_callback_create_deck_link_deck_control_status_callback (void *ctx, cdecklink_deck_control_status_callback_timecode_update *cb0, cdecklink_deck_control_status_callback_vtr_control_state_changed *cb1, cdecklink_deck_control_status_callback_deck_control_event_received *cb2, cdecklink_deck_control_status_callback_deck_control_status_changed *cb3) {
	if (cb0 != nullptr || cb1 != nullptr || cb2 != nullptr || cb3 != nullptr) {
		return new DeckLinkDeckControlStatusCallback(ctx, cb0, cb1, cb2, cb3);
	}
	return nullptr;
}